

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O2

el_action_t vi_change_case(EditLine *el,wint_t c)

{
  el_action_t eVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  wchar_t wVar5;
  
  eVar1 = '\x06';
  if ((el->el_line).cursor < (el->el_line).lastchar) {
    cv_undo(el);
    for (wVar5 = L'\0'; wVar5 < (el->el_state).argument; wVar5 = wVar5 + L'\x01') {
      wVar3 = *(el->el_line).cursor;
      iVar2 = iswupper(wVar3);
      if (iVar2 == 0) {
        iVar2 = iswlower(wVar3);
        if (iVar2 != 0) {
          wVar3 = towupper(wVar3);
          goto LAB_0011d437;
        }
        pwVar4 = (el->el_line).cursor;
      }
      else {
        wVar3 = towlower(wVar3);
LAB_0011d437:
        pwVar4 = (el->el_line).cursor;
        *pwVar4 = wVar3;
      }
      (el->el_line).cursor = pwVar4 + 1;
      if ((el->el_line).lastchar <= pwVar4 + 1) {
        (el->el_line).cursor = pwVar4;
        re_fastaddc(el);
        break;
      }
      re_fastaddc(el);
    }
    eVar1 = '\0';
  }
  return eVar1;
}

Assistant:

libedit_private el_action_t
vi_change_case(EditLine *el, wint_t c)
{
	int i;

	if (el->el_line.cursor >= el->el_line.lastchar)
		return CC_ERROR;
	cv_undo(el);
	for (i = 0; i < el->el_state.argument; i++) {

		c = *el->el_line.cursor;
		if (iswupper(c))
			*el->el_line.cursor = towlower(c);
		else if (iswlower(c))
			*el->el_line.cursor = towupper(c);

		if (++el->el_line.cursor >= el->el_line.lastchar) {
			el->el_line.cursor--;
			re_fastaddc(el);
			break;
		}
		re_fastaddc(el);
	}
	return CC_NORM;
}